

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

void __thiscall
LlvmCompilationContext::LlvmCompilationContext(LlvmCompilationContext *this,ExpressionContext *ctx)

{
  LoopInfo *__s;
  Allocator *pAVar1;
  
  this->ctx = ctx;
  pAVar1 = ctx->allocator;
  (this->types).allocator = pAVar1;
  (this->types).data = (this->types).little;
  (this->types).count = 0;
  (this->types).max = 0x80;
  (this->functions).allocator = pAVar1;
  (this->functions).data = (this->functions).little;
  (this->functions).count = 0;
  (this->functions).max = 0x80;
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
  SmallDenseMap(&this->variables,(Allocator *)0x0);
  pAVar1 = ctx->allocator;
  (this->currentRestoreBlocks).allocator = pAVar1;
  (this->currentRestoreBlocks).data = (this->currentRestoreBlocks).little;
  (this->currentRestoreBlocks).count = 0;
  (this->currentRestoreBlocks).max = 0x10;
  __s = (this->loopInfo).little;
  memset(__s,0,0x200);
  (this->loopInfo).allocator = pAVar1;
  (this->loopInfo).data = __s;
  (this->loopInfo).count = 0;
  (this->loopInfo).max = 0x20;
  this->allocator = ctx->allocator;
  this->enableOptimization = false;
  this->skipFunctionDefinitions = false;
  this->currentNextRestoreBlock = 0;
  this->builder = (LLVMBuilderRef)0x0;
  this->functionPassManager = (LLVMPassManagerRef)0x0;
  this->context = (LLVMContextRef)0x0;
  this->module = (LLVMModuleRef)0x0;
  this->currentFunctionGlobal = false;
  this->currentFunction = (LLVMValueRef)0x0;
  this->currentFunctionSource = (FunctionData *)0x0;
  return;
}

Assistant:

LlvmCompilationContext(ExpressionContext &ctx): ctx(ctx), types(ctx.allocator), functions(ctx.allocator), currentRestoreBlocks(ctx.allocator), loopInfo(ctx.allocator), allocator(ctx.allocator)
	{
		enableOptimization = false;

		context = NULL;

		module = NULL;

		builder = NULL;

		functionPassManager = NULL;

		skipFunctionDefinitions = false;

		currentFunction = NULL;
		currentFunctionSource = NULL;
		currentFunctionGlobal = false;

		currentNextRestoreBlock = 0;
	}